

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsTimeRanges
          (OptimalControlProblem *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  OptimalControlProblemPimpl *pOVar3;
  pointer pTVar4;
  undefined8 uVar5;
  uint uVar6;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *pvVar7;
  _Base_ptr p_Var8;
  pointer pTVar9;
  ulong uVar10;
  long lVar11;
  _Rb_tree_header *p_Var12;
  long lVar13;
  
  uVar6 = countConstraints(this);
  pOVar3 = this->m_pimpl;
  if (((long)(pOVar3->constraintsTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pOVar3->constraintsTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (ulong)uVar6 !=
      0) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pOVar3->constraintsTimeRanges,(ulong)uVar6);
  }
  p_Var8 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var12) {
    lVar13 = 0;
    do {
      pvVar7 = ConstraintsGroup::getTimeRanges((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
      pTVar9 = (pvVar7->
               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar7->
          super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
          )._M_impl.super__Vector_impl_data._M_finish != pTVar9) {
        lVar11 = 0;
        uVar10 = 0;
        do {
          pTVar4 = (this->m_pimpl->constraintsTimeRanges).
                   super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (&pTVar4[lVar13].m_anyTime)[lVar11] = (&pTVar9->m_anyTime)[lVar11];
          puVar1 = (undefined8 *)((long)&pTVar9->m_initTime + lVar11);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pTVar4[lVar13].m_initTime + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          uVar10 = uVar10 + 1;
          pTVar9 = (pvVar7->
                   super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x18;
        } while (uVar10 < (ulong)(((long)(pvVar7->
                                         super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9
                                  >> 3) * -0x5555555555555555));
        lVar13 = lVar13 + uVar10;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var12);
  }
  return &this->m_pimpl->constraintsTimeRanges;
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getConstraintsTimeRanges() const
        {
            unsigned int nc = countConstraints();

            if (m_pimpl->constraintsTimeRanges.size() != nc)
                m_pimpl->constraintsTimeRanges.resize(nc);

            size_t index = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                std::vector<TimeRange> &groupTimeRanges = group.second->group_ptr->getTimeRanges();
                for (size_t i = 0; i < groupTimeRanges.size(); ++i){
                    m_pimpl->constraintsTimeRanges[index] = groupTimeRanges[i];
                    ++index;
                }
            }
            return m_pimpl->constraintsTimeRanges;
        }